

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_neg(CTcPrsNode *subexpr)

{
  int iVar1;
  tc_constval_type_t tVar2;
  CTcConstVal *this;
  long lVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  size_t sVar5;
  char *str;
  CTPNNeg *in_RDI;
  char *new_txt;
  size_t clen;
  char *ctxt;
  vbignum_t b;
  long l;
  CTcConstVal *cval;
  CTcPrsNode *in_stack_ffffffffffffff68;
  vbignum_t *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  CTcPrsMem *in_stack_ffffffffffffff80;
  vbignum_t *in_stack_ffffffffffffff88;
  CTcConstVal *in_stack_ffffffffffffff90;
  CTcConstVal *in_stack_ffffffffffffffa0;
  CTPNNeg *local_8;
  undefined4 extraout_var;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a99bc);
  if (iVar1 == 0) {
    local_8 = (CTPNNeg *)CTcPrsAllocObj::operator_new(0x2a9bf3);
    CTPNNeg::CTPNNeg(local_8,in_stack_ffffffffffffff68);
  }
  else {
    iVar1 = (*(in_RDI->super_CTPNUnary).super_CTPNUnaryBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[1])();
    this = (CTcConstVal *)CONCAT44(extraout_var,iVar1);
    tVar2 = CTcConstVal::get_type(this);
    local_8 = in_RDI;
    if (tVar2 == TC_CVT_INT) {
      lVar3 = CTcConstVal::get_val_int(this);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (lVar3 < -0x7fffffff) {
        vbignum_t::vbignum_t(in_stack_ffffffffffffff70,(ulong)in_stack_ffffffffffffff68);
        CTcConstVal::set_float(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,iVar1);
        vbignum_t::~vbignum_t(in_stack_ffffffffffffff70);
      }
      else {
        CTcConstVal::set_int(this,-lVar3);
      }
    }
    else {
      iVar1 = (*(in_RDI->super_CTPNUnary).super_CTPNUnaryBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                _vptr_CTcPrsNodeBase[1])();
      tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
      if (tVar2 == TC_CVT_FLOAT) {
        pcVar4 = CTcConstVal::get_val_float(this);
        sVar5 = CTcConstVal::get_val_float_len(this);
        if ((sVar5 == 0) || (*pcVar4 != '-')) {
          str = (char *)CTcPrsMem::alloc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          *str = '-';
          memcpy(str + 1,pcVar4,sVar5);
          sVar5 = sVar5 + 1;
          iVar1 = CTcConstVal::is_promoted(this);
          CTcConstVal::set_float(this,str,sVar5,iVar1);
        }
        else {
          in_stack_ffffffffffffffa0 = (CTcConstVal *)(sVar5 - 1);
          iVar1 = CTcConstVal::is_promoted(this);
          CTcConstVal::set_float(this,pcVar4 + 1,(size_t)in_stack_ffffffffffffffa0,iVar1);
        }
        CTcConstVal::demote_float(in_stack_ffffffffffffffa0);
      }
      else {
        pcVar4 = CTcTokenizer::get_op_text(TOKT_MINUS);
        CTcTokenizer::log_error(0x2b01,pcVar4);
      }
    }
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_neg(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* we need an integer or float */
        CTcConstVal *cval = subexpr->get_const_val();
        if (cval->get_type() == TC_CVT_INT)
        {
            /* 
             *   Negating an integer.  There's a special overflow case to
             *   check for: if we're negating INT32MINVAL, the result doesn't
             *   fit in a signed integer, so we need to promote it to float. 
             */
            long l = cval->get_val_int();
            if (l <= INT32MINVAL)
            {
                /* overflow - promote to BigNumber */
                vbignum_t b((ulong)2147483648U);
                cval->set_float(&b, TRUE);
            }
            else
            {
                /* set the value negative in the subexpression */
                cval->set_int(-l);
            }
        }
        else if (subexpr->get_const_val()->get_type() == TC_CVT_FLOAT)
        {
            /* get the original value */
            const char *ctxt = cval->get_val_float();
            size_t clen = cval->get_val_float_len();

            /* if the old value is negative, simply remove the sign */
            if (clen > 0 && ctxt[0] == '-')
            {
                /* keep the old value, removing the sign */
                cval->set_float(ctxt + 1, clen - 1, cval->is_promoted());
            }
            else
            {
                /* allocate new buffer for the float text plus a '-' */
                char *new_txt = (char *)G_prsmem->alloc(clen + 1);

                /* insert the minus sign */
                new_txt[0] = '-';

                /* add the original string */
                memcpy(new_txt + 1, ctxt, clen);

                /* update the subexpression's constant value to the new text */
                cval->set_float(new_txt, clen + 1, cval->is_promoted());
            }

            /* check for possible demotion back to int */
            cval->demote_float();
        }
        else
        {
            /* log the error */
            G_tok->log_error(TCERR_CONST_UNARY_REQ_NUM,
                             G_tok->get_op_text(TOKT_MINUS));
        }

        /* return the modified constant value */
        return subexpr;
    }

    /* create the unary negation node */
    return new CTPNNeg(subexpr);
}